

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O1

int __thiscall BPTree::height(BPTree *this,Node *cursor)

{
  int iVar1;
  
  iVar1 = 0;
  for (; cursor->IS_LEAF == false; cursor = *cursor->ptr) {
    iVar1 = iVar1 + 1;
  }
  return (uint)cursor->IS_LEAF + iVar1;
}

Assistant:

int height(Node* cursor){
        if(cursor->IS_LEAF==false){
            return height(cursor->ptr[0])+1;
        }
        else if(cursor->IS_LEAF==true){
            return 1;
        }
        else{
            return NULL;
        }
    }